

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ray_tracing.cpp
# Opt level: O0

bool dxil_spv::emit_ray_query_intersection_type_instruction
               (Impl *impl,CallInst *instruction,RayQueryIntersection intersection)

{
  CallInst *impl_00;
  bool bVar1;
  Id arg;
  Value *operand;
  Operation *this;
  Operation *op;
  Builder *pBStack_30;
  Id ray_object_id;
  Builder *builder;
  CallInst *pCStack_20;
  RayQueryIntersection intersection_local;
  CallInst *instruction_local;
  Impl *impl_local;
  
  builder._4_4_ = intersection;
  pCStack_20 = instruction;
  instruction_local = (CallInst *)impl;
  pBStack_30 = Converter::Impl::builder(impl);
  impl_00 = instruction_local;
  op._4_4_ = 0;
  operand = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,1);
  bVar1 = build_ray_query_object((Impl *)impl_00,operand,(Id *)((long)&op + 4),(uint32_t *)0x0);
  if (bVar1) {
    this = Converter::Impl::allocate
                     ((Impl *)instruction_local,OpRayQueryGetIntersectionTypeKHR,(Value *)pCStack_20
                     );
    Operation::add_id(this,op._4_4_);
    arg = spv::Builder::makeUintConstant(pBStack_30,builder._4_4_,false);
    Operation::add_id(this,arg);
    Converter::Impl::add((Impl *)instruction_local,this,false);
  }
  return bVar1;
}

Assistant:

bool emit_ray_query_intersection_type_instruction(Converter::Impl &impl, const llvm::CallInst *instruction,
                                                  spv::RayQueryIntersection intersection)
{
	auto &builder = impl.builder();
	spv::Id ray_object_id = 0;
	if (!build_ray_query_object(impl, instruction->getOperand(1), ray_object_id))
		return false;

	auto *op = impl.allocate(spv::OpRayQueryGetIntersectionTypeKHR, instruction);
	op->add_id(ray_object_id);
	op->add_id(builder.makeUintConstant(intersection));
	impl.add(op);
	return true;
}